

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
jessilib::parser::serialize<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,parser *this,object *in_object)

{
  object *in_object_local;
  parser *this_local;
  
  (**(code **)(*(long *)this + 0x48))(__return_storage_ptr__,this,in_object);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> serialize(const object& in_object) {
		if constexpr (std::is_same_v<CharT, char8_t>) {
			return serialize_u8(in_object);
		}
		else if constexpr (std::is_same_v<CharT, char16_t>) {
			return serialize_u16(in_object);
		}
		else if constexpr (std::is_same_v<CharT, char32_t>) {
			return serialize_u32(in_object);
		}
		else if constexpr (std::is_same_v<CharT, wchar_t>) {
			return serialize_w(in_object);
		}
	}